

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O1

If_Man_t * Abc_NtkToIf(Abc_Ntk_t *pNtk,If_Par_t *pPars)

{
  long *plVar1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar2;
  void *pvVar3;
  long *plVar4;
  long lVar5;
  If_Man_t *p;
  size_t sVar6;
  char *__dest;
  Abc_Obj_t *pAVar7;
  If_Obj_t *pIVar8;
  ProgressBar *p_00;
  Vec_Ptr_t *pVVar9;
  long *plVar10;
  long *plVar11;
  char *pcVar12;
  long lVar13;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                  ,0xd9,"If_Man_t *Abc_NtkToIf(Abc_Ntk_t *, If_Par_t *)");
  }
  p = If_ManStart(pPars);
  pcVar12 = pNtk->pName;
  if (pcVar12 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar12);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,pcVar12);
  }
  p->pName = __dest;
  if (1.0 < (double)p->nObjBytes * (double)pNtk->nObjs * 9.313225746154785e-10) {
    printf(
          "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n"
          );
  }
  Abc_NtkCleanCopy(pNtk);
  aVar2 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
  pAVar7 = Abc_AigConst1(pNtk);
  pAVar7->field_6 = aVar2;
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar13];
      pIVar8 = If_ManCreateCi(p);
      *(If_Obj_t **)((long)pvVar3 + 0x40) = pIVar8;
      *(uint *)pIVar8 =
           (*(uint *)pIVar8 & 0x1fff) + (*(uint *)((long)pvVar3 + 0x14) & 0xfffff000) * 2;
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar13 < pVVar9->nSize);
  }
  p_00 = Extra_ProgressBarStart(_stdout,pNtk->vObjs->nSize);
  pVVar9 = Abc_AigDfs(pNtk,0,0);
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      plVar4 = (long *)pVVar9->pArray[lVar13];
      if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar13)) {
        Extra_ProgressBarUpdate_int(p_00,(int)lVar13,"Initial");
      }
      lVar5 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
      pIVar8 = If_ManCreateAnd(p,(If_Obj_t *)
                                 ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                                 *(ulong *)(*(long *)(lVar5 + (long)*(int *)plVar4[4] * 8) + 0x40)),
                               (If_Obj_t *)
                               ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 0xb & 1) ^
                               *(ulong *)(*(long *)(lVar5 + (long)((int *)plVar4[4])[1] * 8) + 0x40)
                               ));
      plVar4[8] = (long)pIVar8;
      if (((ulong)plVar4 & 1) != 0) {
        pcVar12 = "!Abc_ObjIsComplement(pNode)";
LAB_002d3cdd:
        __assert_fail(pcVar12,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                      ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
      }
      if (*(int *)*plVar4 != 3) {
        pcVar12 = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_002d3cdd;
      }
      plVar11 = (long *)plVar4[7];
      if ((plVar11 != (long *)0x0) && (0 < *(int *)((long)plVar4 + 0x2c))) {
        plVar10 = plVar4;
        if (pIVar8->Id <= *(int *)(plVar11[8] + 4)) {
          __assert_fail("If_ObjId(Abc_ObjIfCopy(pNode)) > If_ObjId(Abc_ObjIfCopy(Abc_ObjEquiv(pNode)))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                        ,0xfd,"If_Man_t *Abc_NtkToIf(Abc_Ntk_t *, If_Par_t *)");
        }
        do {
          *(long *)(plVar10[8] + 0x28) = plVar11[8];
          plVar1 = plVar11 + 7;
          plVar10 = plVar11;
          plVar11 = (long *)*plVar1;
        } while ((long *)*plVar1 != (long *)0x0);
        If_ManCreateChoice(p,(If_Obj_t *)plVar4[8]);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
  }
  Extra_ProgressBarStop(p_00);
  if (pVVar9->pArray != (void **)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (void **)0x0;
  }
  if (pVVar9 != (Vec_Ptr_t *)0x0) {
    free(pVVar9);
  }
  pVVar9 = pNtk->vCos;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      plVar4 = (long *)pVVar9->pArray[lVar13];
      pIVar8 = If_ManCreateCo(p,(If_Obj_t *)
                                ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                                *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                                    (long)*(int *)plVar4[4] * 8) + 0x40)));
      plVar4[8] = (long)pIVar8;
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar13 < pVVar9->nSize);
  }
  return p;
}

Assistant:

If_Man_t * Abc_NtkToIf( Abc_Ntk_t * pNtk, If_Par_t * pPars )
{
    ProgressBar * pProgress;
    If_Man_t * pIfMan;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pIfMan = If_ManStart( pPars );
    pIfMan->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );

    // print warning about excessive memory usage
    if ( 1.0 * Abc_NtkObjNum(pNtk) * pIfMan->nObjBytes / (1<<30) > 1.0 )
        printf( "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n", 
            1.0 * Abc_NtkObjNum(pNtk) * pIfMan->nObjBytes / (1<<30), Abc_NtkObjNum(pNtk) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)If_ManConst1( pIfMan );
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateCi( pIfMan );
        // transfer logic level information
        Abc_ObjIfCopy(pNode)->Level = pNode->Level;
    }

    // load the AIG into the mapper
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    vNodes = Abc_AigDfs( pNtk, 0, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, "Initial" );
        // add the node to the mapper
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateAnd( pIfMan, 
            If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin0(pNode)), Abc_ObjFaninC0(pNode) ), 
            If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin1(pNode)), Abc_ObjFaninC1(pNode) ) );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
        {
            Abc_Obj_t * pEquiv;
//            int Counter = 0;
            assert( If_ObjId(Abc_ObjIfCopy(pNode)) > If_ObjId(Abc_ObjIfCopy(Abc_ObjEquiv(pNode))) );
            for ( pPrev = pNode, pEquiv = Abc_ObjEquiv(pPrev); pEquiv; pPrev = pEquiv, pEquiv = Abc_ObjEquiv(pPrev) )
                If_ObjSetChoice( Abc_ObjIfCopy(pPrev), Abc_ObjIfCopy(pEquiv) );//, Counter++;
//            printf( "%d ", Counter );
            If_ManCreateChoice( pIfMan, Abc_ObjIfCopy(pNode) );
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_PtrFree( vNodes );

    // set the primary outputs without copying the phase
    Abc_NtkForEachCo( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateCo( pIfMan, If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin0(pNode)), Abc_ObjFaninC0(pNode) ) );
    return pIfMan;
}